

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void * __thiscall ObjectBlockPool<64,_1024>::Alloc(ObjectBlockPool<64,_1024> *this)

{
  uint index;
  FastVector<LargeBlock<64,_1024>_*,_false,_false> *this_00;
  LargeBlock<64,_1024> *pLVar1;
  LargeBlock<64,_1024> *pLVar2;
  MyLargeBlock *__s;
  LargeBlock<64,_1024> **ppLVar3;
  MySmallBlock *pMVar4;
  uint uVar5;
  MyLargeBlock *newPage;
  MyLargeBlock *local_38;
  
  pMVar4 = this->freeBlocks;
  if (pMVar4 == &this->lastBlock || pMVar4 == (MySmallBlock *)0x0) {
    uVar5 = this->lastNum;
    if (uVar5 == 0x400) {
      __s = (MyLargeBlock *)NULLC::alignedAlloc(0x10010);
      local_38 = __s;
      memset(__s,0,0x10010);
      __s->next = this->activePages;
      this->activePages = __s;
      this->lastNum = 0;
      this_00 = &this->sortedPages;
      FastVector<LargeBlock<64,_1024>_*,_false,_false>::push_back(this_00,&local_38);
      for (uVar5 = (this->sortedPages).count - 2; index = uVar5 + 1, 0 < (int)index;
          uVar5 = uVar5 - 1) {
        ppLVar3 = FastVector<LargeBlock<64,_1024>_*,_false,_false>::operator[](this_00,index);
        pLVar1 = *ppLVar3;
        ppLVar3 = FastVector<LargeBlock<64,_1024>_*,_false,_false>::operator[](this_00,uVar5);
        if (*ppLVar3 <= pLVar1) break;
        ppLVar3 = FastVector<LargeBlock<64,_1024>_*,_false,_false>::operator[](this_00,index);
        pLVar1 = *ppLVar3;
        ppLVar3 = FastVector<LargeBlock<64,_1024>_*,_false,_false>::operator[](this_00,uVar5);
        pLVar2 = *ppLVar3;
        ppLVar3 = FastVector<LargeBlock<64,_1024>_*,_false,_false>::operator[](this_00,index);
        *ppLVar3 = pLVar2;
        ppLVar3 = FastVector<LargeBlock<64,_1024>_*,_false,_false>::operator[](this_00,uVar5);
        *ppLVar3 = pLVar1;
      }
      uVar5 = this->lastNum;
    }
    this->lastNum = uVar5 + 1;
    pMVar4 = this->activePages->page + uVar5;
  }
  else {
    this->freeBlocks =
         (MySmallBlock *)(((ulong)(NULLC::OBJECT_MASK - 1) | 0xfffffffffffffffc) & pMVar4->marker);
  }
  return pMVar4;
}

Assistant:

void* Alloc()
	{
		MySmallBlock*	result;
		if(freeBlocks && freeBlocks != &lastBlock)
		{
			result = freeBlocks;
			freeBlocks = (MySmallBlock*)((intptr_t)freeBlocks->next & ~NULLC::OBJECT_MASK);
		}else{
			if(lastNum == countInBlock)
			{
				MyLargeBlock* newPage = new(NULLC::alignedAlloc(sizeof(MyLargeBlock))) MyLargeBlock;
				memset(newPage, 0, sizeof(MyLargeBlock));
				newPage->next = activePages;
				activePages = newPage;
				lastNum = 0;
				sortedPages.push_back(newPage);
				int index = sortedPages.size() - 1;
				while(index > 0 && sortedPages[index] < sortedPages[index - 1])
				{
					MyLargeBlock *tmp = sortedPages[index];
					sortedPages[index] = sortedPages[index - 1];
					sortedPages[index - 1] = tmp;
					index--;
				}
			}
			result = &activePages->page[lastNum++];
		}
		return result;
	}